

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

_Bool unix_add_keyfile(char *filename_str,_Bool add_encrypted)

{
  int iVar1;
  Filename *filename;
  char *prompt;
  char *passphrase;
  size_t n;
  _Bool _Var2;
  char *err;
  char *local_40;
  char *local_38;
  
  filename = filename_from_str(filename_str);
  iVar1 = pageant_add_keyfile(filename,(char *)0x0,&local_40,add_encrypted);
  _Var2 = true;
  if (iVar1 != 0) {
    if (iVar1 != 1) {
      local_38 = filename_str;
      do {
        prompt = dupprintf("Enter passphrase to load key \'%s\'",local_40);
        passphrase = askpass(prompt);
        safefree(local_40);
        safefree(prompt);
        local_40 = (char *)0x0;
        if (passphrase == (char *)0x0) {
LAB_0010b56a:
          _Var2 = true;
          goto LAB_0010b56d;
        }
        iVar1 = pageant_add_keyfile(filename,passphrase,&local_40,add_encrypted);
        n = strlen(passphrase);
        smemclr(passphrase,n);
        safefree(passphrase);
        if (iVar1 == 0) goto LAB_0010b56a;
        filename_str = local_38;
      } while (iVar1 != 1);
    }
    _Var2 = false;
    fprintf(_stderr,"pageant: %s: %s\n",filename_str,local_40);
  }
LAB_0010b56d:
  safefree(local_40);
  filename_free(filename);
  return _Var2;
}

Assistant:

static bool unix_add_keyfile(const char *filename_str, bool add_encrypted)
{
    Filename *filename = filename_from_str(filename_str);
    int status;
    bool ret;
    char *err;

    ret = true;

    /*
     * Try without a passphrase.
     */
    status = pageant_add_keyfile(filename, NULL, &err, add_encrypted);
    if (status == PAGEANT_ACTION_OK) {
        goto cleanup;
    } else if (status == PAGEANT_ACTION_FAILURE) {
        fprintf(stderr, "pageant: %s: %s\n", filename_str, err);
        ret = false;
        goto cleanup;
    }

    /*
     * And now try prompting for a passphrase.
     */
    while (1) {
        char *prompt = dupprintf(
            "Enter passphrase to load key '%s'", err);
        char *passphrase = askpass(prompt);
        sfree(err);
        sfree(prompt);
        err = NULL;
        if (!passphrase)
            break;

        status = pageant_add_keyfile(filename, passphrase, &err,
                                     add_encrypted);

        smemclr(passphrase, strlen(passphrase));
        sfree(passphrase);
        passphrase = NULL;

        if (status == PAGEANT_ACTION_OK) {
            goto cleanup;
        } else if (status == PAGEANT_ACTION_FAILURE) {
            fprintf(stderr, "pageant: %s: %s\n", filename_str, err);
            ret = false;
            goto cleanup;
        }
    }

  cleanup:
    sfree(err);
    filename_free(filename);
    return ret;
}